

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O2

void ssh2transport_finalise_exhash(ssh2_transport_state *s)

{
  ptrlen pl;
  
  pl.ptr = s->kex_shared_secret->u;
  pl.len = s->kex_shared_secret->len;
  BinarySink_put_datapl(s->exhash->binarysink_,pl);
  if (s->exhash->vt->hlen < 0x73) {
    ssh_hash_final(s->exhash,s->exchange_hash);
    s->exhash = (ssh_hash *)0x0;
    return;
  }
  __assert_fail("ssh_hash_alg(s->exhash)->hlen <= sizeof(s->exchange_hash)",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/transport2.c"
                ,0x49a,"void ssh2transport_finalise_exhash(struct ssh2_transport_state *)");
}

Assistant:

void ssh2transport_finalise_exhash(struct ssh2_transport_state *s)
{
    put_datapl(s->exhash, ptrlen_from_strbuf(s->kex_shared_secret));
    assert(ssh_hash_alg(s->exhash)->hlen <= sizeof(s->exchange_hash));
    ssh_hash_final(s->exhash, s->exchange_hash);
    s->exhash = NULL;

#if 0
    debug("Exchange hash is:\n");
    dmemdump(s->exchange_hash, s->kex_alg->hash->hlen);
#endif
}